

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<bool>::endExpression(ExpressionLhs<bool> *this,Flags resultDisposition)

{
  bool bVar1;
  OfType OVar2;
  char *pcVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  bVar1 = this->m_lhs;
  pcVar3 = "false";
  if ((ulong)bVar1 != 0) {
    pcVar3 = "true";
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,pcVar3,pcVar3 + ((ulong)bVar1 ^ 5));
  std::__cxx11::string::_M_assign((string *)&(this->m_result).m_exprComponents.lhs);
  OVar2 = ExpressionFailed;
  if (bVar1 != false) {
    OVar2 = Ok;
  }
  (this->m_result).m_data.resultType = OVar2;
  (this->m_result).m_exprComponents.shouldNegate = (bool)((byte)(resultDisposition >> 1) & 1);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return &this->m_result;
}

Assistant:

ExpressionResultBuilder& endExpression( ResultDisposition::Flags resultDisposition ) {
        bool value = m_lhs ? true : false;
        return m_result
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression( resultDisposition );
    }